

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanKampenUtils.cpp
# Opt level: O0

size_t __thiscall van_kampen::ProcessLogger::iterate(ProcessLogger *this)

{
  size_t sVar1;
  size_t sVar2;
  int args_1;
  char *args;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int percent;
  ProcessLogger *this_local;
  
  if (this->currentIt_ < this->total_) {
    this->currentIt_ = this->currentIt_ + 1;
    sVar1 = this->currentIt_;
    auVar3._8_4_ = (int)(sVar1 >> 0x20);
    auVar3._0_8_ = sVar1;
    auVar3._12_4_ = 0x45300000;
    sVar2 = this->total_;
    auVar4._8_4_ = (int)(sVar2 >> 0x20);
    auVar4._0_8_ = sVar2;
    auVar4._12_4_ = 0x45300000;
    args_1 = (int)((((auVar3._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                   ((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) * 100.0);
    if (args_1 != this->lastResult) {
      this->lastResult = args_1;
      args = "";
      if (args_1 < 10) {
        args = " ";
      }
      log<char_const*,int,char_const*>(this,args,args_1,"%    ");
    }
    this_local = (ProcessLogger *)this->currentIt_;
  }
  else {
    this_local = (ProcessLogger *)this->total_;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t ProcessLogger::iterate()
{
    if (currentIt_ >= total_)
    {
        return total_;
    }
    ++currentIt_;
    int percent = (static_cast<double>(currentIt_) / static_cast<double>(total_)) * 100.0;
    if (percent != lastResult)
    {
        lastResult = percent;
        log((percent < 10 ? " " : ""), percent, "%    ");
    }
    return currentIt_;
}